

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int header_bin_be(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,
                 size_t *name_pad)

{
  int iVar1;
  archive_read *a_00;
  ulong *in_RCX;
  archive_entry *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  uchar *header;
  void *h;
  size_t in_stack_ffffffffffffffb8;
  archive_entry *entry_00;
  archive_read *in_stack_ffffffffffffffc0;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x10) = 0x10003;
  *(char **)(in_RDI + 0x18) = "cpio (big-endian binary)";
  a_00 = (archive_read *)
         __archive_read_ahead
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x258acc);
  if (a_00 == (archive_read *)0x0) {
    local_4 = -0x1e;
  }
  else {
    archive_entry_set_dev
              (in_RDX,(long)(int)((uint)*(byte *)((long)&(a_00->archive).magic + 2) * 0x100 +
                                 (uint)*(byte *)((long)&(a_00->archive).magic + 3)));
    archive_entry_set_ino
              (in_RDX,(long)(int)((uint)(byte)(a_00->archive).state * 0x100 +
                                 (uint)*(byte *)((long)&(a_00->archive).state + 1)));
    archive_entry_set_mode
              (in_RDX,(uint)*(byte *)((long)&(a_00->archive).state + 2) * 0x100 +
                      (uint)*(byte *)((long)&(a_00->archive).state + 3));
    archive_entry_set_uid
              (in_RDX,(long)(int)((uint)*(byte *)&(a_00->archive).vtable * 0x100 +
                                 (uint)*(byte *)((long)&(a_00->archive).vtable + 1)));
    archive_entry_set_gid
              (in_RDX,(long)(int)((uint)*(byte *)((long)&(a_00->archive).vtable + 2) * 0x100 +
                                 (uint)*(byte *)((long)&(a_00->archive).vtable + 3)));
    archive_entry_set_nlink
              (in_RDX,(uint)*(byte *)((long)&(a_00->archive).vtable + 4) * 0x100 +
                      (uint)*(byte *)((long)&(a_00->archive).vtable + 5));
    archive_entry_set_rdev
              (in_RDX,(long)(int)((uint)*(byte *)((long)&(a_00->archive).vtable + 6) * 0x100 +
                                 (uint)*(byte *)((long)&(a_00->archive).vtable + 7)));
    entry_00 = in_RDX;
    iVar1 = be4((uchar *)&(a_00->archive).archive_format);
    archive_entry_set_mtime(entry_00,(long)iVar1,0);
    *in_RCX = (long)(int)((uint)(byte)(a_00->archive).field_0x14 * 0x100 +
                         (uint)(byte)(a_00->archive).field_0x15);
    *in_R8 = *in_RCX & 1;
    iVar1 = be4(&(a_00->archive).field_0x16);
    *(long *)(in_RSI + 0x18) = (long)iVar1;
    archive_entry_set_size(in_RDX,*(int64_t *)(in_RSI + 0x18));
    *(ulong *)(in_RSI + 0x30) = *(ulong *)(in_RSI + 0x18) & 1;
    __archive_read_consume(a_00,(int64_t)entry_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
header_bin_be(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const unsigned char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_BIN_BE;
	a->archive.archive_format_name = "cpio (big-endian binary)";

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, bin_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out binary fields. */
	header = (const unsigned char *)h;

	archive_entry_set_dev(entry, header[bin_dev_offset] * 256 + header[bin_dev_offset + 1]);
	archive_entry_set_ino(entry, header[bin_ino_offset] * 256 + header[bin_ino_offset + 1]);
	archive_entry_set_mode(entry, header[bin_mode_offset] * 256 + header[bin_mode_offset + 1]);
	archive_entry_set_uid(entry, header[bin_uid_offset] * 256 + header[bin_uid_offset + 1]);
	archive_entry_set_gid(entry, header[bin_gid_offset] * 256 + header[bin_gid_offset + 1]);
	archive_entry_set_nlink(entry, header[bin_nlink_offset] * 256 + header[bin_nlink_offset + 1]);
	archive_entry_set_rdev(entry, header[bin_rdev_offset] * 256 + header[bin_rdev_offset + 1]);
	archive_entry_set_mtime(entry, be4(header + bin_mtime_offset), 0);
	*namelength = header[bin_namesize_offset] * 256 + header[bin_namesize_offset + 1];
	*name_pad = *namelength & 1; /* Pad to even. */

	cpio->entry_bytes_remaining = be4(header + bin_filesize_offset);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = cpio->entry_bytes_remaining & 1; /* Pad to even. */
	    __archive_read_consume(a, bin_header_size);
	return (ARCHIVE_OK);
}